

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O1

void __thiscall
MeshDenoisingViaL0Minimization::solveVertices
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,MatrixXd *initial_vertices_matrix,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef,vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *delta,double alpha,double beta)

{
  size_t *this_00;
  size_t *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  int *piVar6;
  long lVar7;
  VertexHandle _idx;
  bool bVar8;
  Index rows;
  Index cols;
  value_type _fh;
  int iVar9;
  value_type vVar10;
  undefined8 *puVar11;
  mapped_type *pmVar12;
  Face *pFVar13;
  long lVar14;
  _Base_ptr p_Var15;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_02;
  reference pvVar16;
  _Self __tmp;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  VertexIter VVar22;
  undefined1 auStack_3c8 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> coef_matrix;
  map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
  vertex_coef;
  set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
  edge_handle;
  BaseHandle local_128;
  VertexHandle v3;
  undefined1 auStack_124 [12];
  void *local_110;
  MatrixXd right_term;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triple;
  undefined1 local_c0 [8];
  VertexIter v_it;
  undefined1 auStack_a8 [8];
  MatrixXd vertices_term;
  double local_70;
  double local_68;
  double local_60;
  key_type local_4c;
  double dStack_48;
  VertexHandle v4;
  
  pdVar5 = (double *)
           (initial_vertices_matrix->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar14 = (initial_vertices_matrix->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  uVar17 = lVar14 * (long)pdVar5;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)delta;
  dStack_48 = alpha;
  if (uVar17 == 0) {
    local_110 = (void *)0x0;
  }
  else if ((uVar17 >> 0x3d != 0) || (local_110 = malloc(uVar17 * 8), local_110 == (void *)0x0)) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = std::streambuf::xsgetn;
    __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar5;
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       lVar14;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)initial_vertices_matrix);
  rows = (**(code **)(*(long *)&(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     + 0x10))(mesh);
  cols = (**(code **)(*(long *)&(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     + 0x10))(mesh);
  solver.m_detPermR._0_1_ = 0;
  stack0xfffffffffffffe1c = 0;
  coef_matrix.m_innerSize = 0;
  coef_matrix._12_4_ = 0;
  coef_matrix.m_outerIndex = (Index *)0x0;
  coef_matrix.m_innerNonZeros = (Index *)0x0;
  coef_matrix.m_data.m_values = (Scalar_conflict *)0x0;
  coef_matrix.m_data.m_indices = (Index *)0x0;
  coef_matrix.m_data.m_size = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermR,rows,cols);
  right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  triple.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vertex_coef;
  vertex_coef._M_t._M_impl._0_4_ = 0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&edge_handle;
  edge_handle._M_t._M_impl._0_4_ = 0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  _local_c0 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  this_00 = &vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this_01 = &coef_matrix.m_data.m_allocatedSize;
  while( true ) {
    VVar22 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    if ((local_c0 == (undefined1  [8])VVar22.mesh_) &&
       (v_it.mesh_._0_4_ == (BaseHandle)VVar22.hnd_.super_BaseHandle.idx_)) break;
    std::
    _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
    ::clear((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
             *)this_00);
    std::
    _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
    ::clear((_Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
             *)this_01);
    pmVar12 = std::
              map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
              ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                            *)this_01,(key_type *)&v_it);
    *pmVar12 = 1.0;
    OpenMesh::Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::GenericCirculatorT
              ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                *)auStack_3c8,(mesh_ref)mesh,(VertexHandle)v_it.mesh_._0_4_,false);
    while ((solver._4_4_ != -1 &&
           ((solver.m_info != solver._4_4_ || ((int)solver.m_lastError._M_dataplus._M_p == 0))))) {
      _fh = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                         *)auStack_3c8);
      pFVar13 = OpenMesh::ArrayKernel::face
                          ((ArrayKernel *)mesh,(FaceHandle)_fh.super_BaseHandle.idx_);
      iVar9 = (pFVar13->halfedge_handle_).super_BaseHandle.idx_;
      vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)CONCAT44(iVar9,iVar9);
      vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = -0x100000000;
      auStack_a8 = (undefined1  [8])mesh;
      while ((iVar9 != -1 &&
             (((int)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data != iVar9 ||
              ((int)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows == 0))))) {
        vVar10 = OpenMesh::Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                 ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                              *)auStack_a8);
        local_128 = vVar10.super_BaseHandle.idx_;
        std::
        _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
        ::_M_insert_unique<OpenMesh::EdgeHandle>
                  ((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                    *)this_00,(EdgeHandle *)&stack0xfffffffffffffed8);
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                      *)&stack0xfffffffffffffed8,
                     (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                      *)auStack_a8,0);
        iVar9 = vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data._4_4_;
      }
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)auStack_a8,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)auStack_3c8,0);
    }
    if (edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)&edge_handle) {
      local_60 = 0.0;
      local_68 = 0.0;
      local_70 = 0.0;
    }
    else {
      local_70 = 0.0;
      local_68 = 0.0;
      local_60 = 0.0;
      p_Var15 = edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        bVar8 = OpenMesh::PolyConnectivity::is_boundary
                          ((PolyConnectivity *)mesh,(EdgeHandle)p_Var15[1]._M_color);
        if (!bVar8) {
          lVar14 = (long)(int)p_Var15[1]._M_color;
          lVar7 = lVar14 * 0x18;
          piVar6 = *(int **)&(edge_vertex_handle->
                             super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar14].
                             super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             ._M_impl.super__Vector_impl_data;
          auStack_3c8._0_4_ = *piVar6;
          auStack_a8._0_4_ = piVar6[1];
          local_128.idx_ = piVar6[2];
          local_4c.super_BaseHandle.idx_ = (BaseHandle)piVar6[3];
          pdVar5 = (coef->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar14].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar20 = *pdVar5;
          dVar21 = pdVar5[1];
          dVar19 = pdVar5[2];
          v_it._8_8_ = pdVar5[3];
          lVar14 = *(long *)edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count;
          dVar1 = *(double *)(lVar14 + lVar7);
          dVar2 = *(double *)(lVar14 + 8 + lVar7);
          dVar3 = *(double *)(lVar14 + 0x10 + lVar7);
          if ((BaseHandle)*piVar6 == v_it.mesh_._0_4_) {
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3c8);
            dVar4 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3c8);
            dVar18 = dVar20 * beta;
            *pmVar12 = dVar18 * dVar20 + dVar4 + dStack_48;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_a8);
            dVar4 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_a8);
            *pmVar12 = dVar21 * dVar18 + (dVar4 - dStack_48);
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffed8);
            dVar21 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffed8);
            *pmVar12 = dVar19 * dVar18 + dVar21 + dStack_48;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            dVar21 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            *pmVar12 = dVar18 * (double)v_it._8_8_ + (dVar21 - dStack_48);
            dVar19 = dVar20;
LAB_0016345a:
            dVar21 = dVar1 * beta * dVar19;
            dVar20 = dVar2 * beta * dVar19;
            dVar19 = dVar3 * beta * dVar19;
          }
          else {
            if ((BaseHandle)piVar6[1] == v_it.mesh_._0_4_) {
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3c8);
              dVar4 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3c8);
              dVar18 = dVar21 * beta;
              *pmVar12 = dVar20 * dVar18 + (dVar4 - dStack_48);
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_a8);
              dVar20 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_a8);
              *pmVar12 = dVar18 * dVar21 + dVar20 + dStack_48;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffed8);
              dVar20 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffed8);
              *pmVar12 = dVar19 * dVar18 + (dVar20 - dStack_48);
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              dVar20 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              *pmVar12 = dVar18 * (double)v_it._8_8_ + dVar20 + dStack_48;
              dVar19 = dVar21;
              goto LAB_0016345a;
            }
            if ((BaseHandle)piVar6[2] == v_it.mesh_._0_4_) {
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3c8);
              dVar4 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_3c8);
              dVar18 = dVar19 * beta;
              *pmVar12 = dVar20 * dVar18 + dVar4 + dStack_48;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_a8);
              dVar20 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)auStack_a8);
              *pmVar12 = dVar21 * dVar18 + (dVar20 - dStack_48);
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffed8);
              dVar20 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,(key_type *)&stack0xfffffffffffffed8);
              *pmVar12 = dVar18 * dVar19 + dVar20 + dStack_48;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              dVar20 = *pmVar12;
              pmVar12 = std::
                        map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                        ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                      *)this_01,&local_4c);
              *pmVar12 = dVar18 * (double)v_it._8_8_ + (dVar20 - dStack_48);
              goto LAB_0016345a;
            }
            if (local_4c.super_BaseHandle.idx_ != v_it.mesh_._0_4_) goto LAB_00163490;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3c8);
            dVar4 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_3c8);
            dVar18 = (double)v_it._8_8_ * beta;
            *pmVar12 = dVar20 * dVar18 + (dVar4 - dStack_48);
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_a8);
            dVar20 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)auStack_a8);
            *pmVar12 = dVar21 * dVar18 + dVar20 + dStack_48;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffed8);
            dVar20 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&stack0xfffffffffffffed8);
            *pmVar12 = dVar19 * dVar18 + (dVar20 - dStack_48);
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            dVar20 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,&local_4c);
            *pmVar12 = dVar18 * (double)v_it._8_8_ + dVar20 + dStack_48;
            dVar21 = dVar1 * beta * (double)v_it._8_8_;
            dVar20 = dVar2 * beta * (double)v_it._8_8_;
            dVar19 = dVar3 * beta * (double)v_it._8_8_;
          }
          local_60 = local_60 + dVar21;
          local_68 = local_68 + dVar20;
          local_70 = local_70 + dVar19;
        }
LAB_00163490:
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while (p_Var15 != (_Rb_tree_node_base *)&edge_handle);
    }
    lVar14 = (long)(int)v_it.mesh_._0_4_;
    if ((((lVar14 < 0) ||
         ((long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data <= lVar14)) ||
        (right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows < 1)) ||
       ((*(double *)((long)local_110 + lVar14 * 8) =
              local_60 + *(double *)((long)local_110 + lVar14 * 8),
        right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        == 1 || (*(double *)
                  ((long)local_110 +
                  lVar14 * 8 +
                  (long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data * 8) =
                      local_68 +
                      *(double *)
                       ((long)local_110 +
                       lVar14 * 8 +
                       (long)right_term.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data * 8),
                right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows < 3)))) goto LAB_001639cc;
    *(double *)
     ((long)local_110 +
     lVar14 * 8 +
     (long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data * 0x10) =
         local_70 +
         *(double *)
          ((long)local_110 +
          lVar14 * 8 +
          (long)right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data * 0x10);
    for (p_Var15 = vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 != (_Rb_tree_node_base *)&vertex_coef;
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
      auStack_3c8._4_4_ = p_Var15[1]._M_color;
      auStack_3c8._0_4_ = v_it.mesh_._0_4_;
      solver._0_8_ = p_Var15[1]._M_parent;
      if (triple.
          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
        _M_realloc_insert<Eigen::Triplet<double,int>>
                  ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                   &right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,(iterator)0x0,(Triplet<double,_int> *)auStack_3c8);
      }
      else {
        (triple.
         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_row = (int)v_it.mesh_._0_4_;
        (triple.
         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_col = auStack_3c8._4_4_;
        (triple.
         super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->m_value = (double)solver._0_8_;
        triple.
        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             triple.
             super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
    if (v_it.mesh_._4_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_c0);
    }
  }
  auStack_3c8 = (undefined1  [8])
                right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
  auStack_a8 = (undefined1  [8])
               triple.
               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  Eigen::internal::
  set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
            ((__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)auStack_3c8,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)auStack_a8,(SparseMatrix<double,_0,_int> *)&solver.m_detPermR,0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             auStack_3c8);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             auStack_3c8,(MatrixType *)&solver.m_detPermR);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
             auStack_3c8,(MatrixType *)&solver.m_detPermR);
  if (auStack_3c8[5] == false) {
    __assert_fail("m_factorizationIsOk && \"SparseLU is not initialized.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0xb4,
                  "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      != (double *)(long)(int)solver.m_mat._0_4_) {
    __assert_fail("rows()==B.rows() && \"SparseLU::solve(): invalid number of rows of the right hand side matrix B\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0xb6,
                  "const internal::solve_retval<SparseLU<_MatrixType, _OrderingType>, Rhs> Eigen::SparseLU<Eigen::SparseMatrix<double>>::solve(const MatrixBase<Rhs> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  auStack_a8 = (undefined1  [8])0x0;
  vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  uVar17 = (ulong)(int)solver.m_lastError.field_2._12_4_;
  if ((long)(right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows | uVar17) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       != 0 && solver.m_lastError.field_2._12_4_ != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816(right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows),0) < (long)uVar17)) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = std::streambuf::xsgetn;
    __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)auStack_a8,
             right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows * uVar17,uVar17,
             right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows);
  Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
  _solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *)auStack_3c8,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_110,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)auStack_a8);
  _local_128 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  while( true ) {
    VVar22 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)mesh);
    _idx.super_BaseHandle.idx_ = v3.super_BaseHandle.idx_;
    if (v3.super_BaseHandle.idx_ == ((BaseHandle)VVar22.hnd_.super_BaseHandle.idx_).super_BaseHandle
        && _local_128 == VVar22.mesh_) {
      free((void *)auStack_a8);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 auStack_3c8);
      std::
      _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                   *)&vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   *)&coef_matrix.m_data.m_allocatedSize);
      if (right_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols != 0) {
        operator_delete((void *)right_term.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols);
      }
      free((void *)coef_matrix._8_8_);
      free(coef_matrix.m_outerIndex);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
                ((CompressedStorage<double,_int> *)&coef_matrix.m_innerNonZeros);
      free(local_110);
      return;
    }
    if (((((int)v3.super_BaseHandle.idx_ < 0) ||
         (lVar14 = (long)(int)v3.super_BaseHandle.idx_,
         (long)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data <= lVar14)) ||
        (vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows < 1)) ||
       ((vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows == 1 ||
        (vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows < 3)))) break;
    dStack_48 = *(double *)
                 (&(((Mesh *)auStack_a8)->
                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                   ).
                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   .field_0x0 + lVar14 * 8);
    dVar20 = *(double *)
              (&(((Mesh *)auStack_a8)->
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                ).
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .field_0x0 +
              lVar14 * 8 +
              (long)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data * 8);
    dVar21 = *(double *)
              (&((Triplet<double,_int> *)
                ((long)auStack_a8 +
                vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data * 0x10))->m_row + lVar14 * 2);
    this_02 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                        ((PropertyContainer *)
                         &(mesh->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .field_0x8,
                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                         (mesh->super_Mesh).
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                         super_BaseHandle.idx_);
    pvVar16 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                        (this_02,(int)_idx.super_BaseHandle.idx_);
    (pvVar16->super_VectorDataT<double,_3>).values_[0] = dStack_48;
    (pvVar16->super_VectorDataT<double,_3>).values_[1] = dVar20;
    (pvVar16->super_VectorDataT<double,_3>).values_[2] = dVar21;
    v3.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)((int)v3.super_BaseHandle.idx_ + 1);
    if (auStack_124._8_4_ != 0) {
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
      ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)&stack0xfffffffffffffed8);
    }
  }
LAB_001639cc:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x151,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
               );
}

Assistant:

void MeshDenoisingViaL0Minimization::solveVertices(TriMesh &mesh, Eigen::MatrixXd &initial_vertices_matrix,
                                                   std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                   std::vector< std::vector<double> > &coef, std::vector<TriMesh::Point> &delta,
                                                   double alpha, double beta)
{
    Eigen::MatrixXd right_term = initial_vertices_matrix;
    Eigen::SparseMatrix<double> coef_matrix((int)mesh.n_vertices(), (int)mesh.n_vertices());

    std::vector< Eigen::Triplet<double> > triple; triple.clear();

    std::map<TriMesh::VertexHandle, double> vertex_coef;
    std::set<TriMesh::EdgeHandle> edge_handle;;
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        edge_handle.clear();
        vertex_coef.clear();
        vertex_coef[*v_it] = 1.0;
        for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(*v_it); vf_it.is_valid(); vf_it++)
        {
            for(TriMesh::FaceEdgeIter fe_it = mesh.fe_iter(*vf_it); fe_it.is_valid(); fe_it++)
            {
                edge_handle.insert(*fe_it);
            }
        }

        TriMesh::Point right(0.0, 0.0, 0.0);
        for(std::set<TriMesh::EdgeHandle>::iterator s_it = edge_handle.begin(); s_it != edge_handle.end(); s_it++)
        {
            if(!mesh.is_boundary(*s_it))
            {
                int index = (*s_it).idx();
                TriMesh::VertexHandle v1 = edge_vertex_handle[index][0],
                        v2 = edge_vertex_handle[index][1],
                        v3 = edge_vertex_handle[index][2],
                        v4 = edge_vertex_handle[index][3];
                double coe1 = coef[index][0],
                        coe2 = coef[index][1],
                        coe3 = coef[index][2],
                        coe4 = coef[index][3];
                TriMesh::Point temp_delta = delta[index];
                if(v1 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe1 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe1 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe1 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe1 * coe4;
                    right += temp_delta * beta * coe1;
                }
                else if(v2 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe2 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe2 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe2 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe2 * coe4;
                    right += temp_delta * beta * coe2;
                }
                else if(v3 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe3 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe3 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe3 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe3 * coe4;
                    right += temp_delta * beta * coe3;
                }
                else if(v4 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe4 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe4 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe4 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe4 * coe4;
                    right += temp_delta * beta * coe4;
                }
            }
        }
        right_term(v_it->idx(), 0) += right[0];
        right_term(v_it->idx(), 1) += right[1];
        right_term(v_it->idx(), 2) += right[2];

        for(std::map<TriMesh::VertexHandle, double>::iterator m_it = vertex_coef.begin(); m_it != vertex_coef.end(); m_it++)
        {
            triple.push_back(Eigen::Triplet<double>(v_it->idx(), m_it->first.idx(), m_it->second));
        }
    }
    coef_matrix.setFromTriplets(triple.begin(), triple.end());

    Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
    solver.analyzePattern(coef_matrix);
    solver.factorize(coef_matrix);
    Eigen::MatrixXd vertices_term = solver.solve(right_term);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point pt = TriMesh::Point(vertices_term(index,0), vertices_term(index,1), vertices_term(index,2));
        mesh.set_point(*v_it, pt);
    }
}